

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

double * __thiscall Graph::getLossesReseting(Graph *this)

{
  Vertex *pVVar1;
  Edge *pEVar2;
  double *pdVar3;
  Edge **ppEVar4;
  double dVar5;
  double dVar6;
  
  pdVar3 = (double *)operator_new__(0x10);
  *pdVar3 = 0.0;
  pdVar3[1] = 0.0;
  dVar5 = 0.0;
  dVar6 = 0.0;
  while (pVVar1 = this->verticesList, pVVar1 != (Vertex *)0x0) {
    pVVar1->idTree = pVVar1->id;
    ppEVar4 = &pVVar1->edgesList;
    while (pEVar2 = *ppEVar4, pEVar2 != (Edge *)0x0) {
      dVar5 = dVar5 + pEVar2->activeLoss;
      dVar6 = dVar6 + pEVar2->reactiveLoss;
      *pdVar3 = dVar5;
      pdVar3[1] = dVar6;
      pEVar2->closed = (bool)(pEVar2->modifiable ^ 1);
      pEVar2->activePowerFlow = 0.0;
      pEVar2->reactivePowerFlow = 0.0;
      pEVar2->activeLoss = 0.0;
      pEVar2->reactiveLoss = 0.0;
      ppEVar4 = &pEVar2->nextEdge;
    }
    this = (Graph *)&pVVar1->nextVertex;
  }
  return pdVar3;
}

Assistant:

double *Graph::getLossesReseting(){
    double *perda = new double[2]; perda[0] = perda[1] = 0.0;
    for(Vertex *no=verticesList; no != NULL; no = no->getNext()){
        no->setIdTree(no->getID());
        for(Edge *a = no->getEdgesList(); a != NULL; a = a->getNext()){
            perda[0] += a->getActiveLoss();
            perda[1] += a->getReactiveLoss();

            //arcos nao modificaveis ficam sempre fechados
            if(a->getModifiable() == false)
                a->setSwitch(true);
            else
                a->setSwitch(false);

            a->setActiveFlow(0.0);
            a->setReactiveFlow(0.0);
            a->setActiveLoss(0.0);
            a->setReactiveLoss(0.0);
        }
    }
    return perda;
}